

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderDockWindow(char *window_name,ImGuiID node_id)

{
  ImU32 id;
  ImGuiWindow *window_00;
  ImGuiWindowSettings *local_28;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  ImGuiID window_id;
  ImGuiID node_id_local;
  char *window_name_local;
  
  id = ImHashStr(window_name,0,0);
  window_00 = FindWindowByID(id);
  if (window_00 == (ImGuiWindow *)0x0) {
    local_28 = FindWindowSettings(id);
    if (local_28 == (ImGuiWindowSettings *)0x0) {
      local_28 = CreateNewWindowSettings(window_name);
    }
    local_28->DockId = node_id;
    local_28->DockOrder = -1;
  }
  else {
    SetWindowDock(window_00,node_id,1);
    window_00->DockOrder = -1;
  }
  return;
}

Assistant:

void ImGui::DockBuilderDockWindow(const char* window_name, ImGuiID node_id)
{
    // We don't preserve relative order of multiple docked windows (by clearing DockOrder back to -1)
    ImGuiID window_id = ImHashStr(window_name);
    if (ImGuiWindow* window = FindWindowByID(window_id))
    {
        // Apply to created window
        SetWindowDock(window, node_id, ImGuiCond_Always);
        window->DockOrder = -1;
    }
    else
    {
        // Apply to settings
        ImGuiWindowSettings* settings = FindWindowSettings(window_id);
        if (settings == NULL)
            settings = CreateNewWindowSettings(window_name);
        settings->DockId = node_id;
        settings->DockOrder = -1;
    }
}